

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_storage.cpp
# Opt level: O0

intrusive_ptr<cppcms::impl::base_cache>
cppcms::impl::process_cache_factory(size_t memory,uint items)

{
  intrusive_ptr<cppcms::impl::base_cache> *this;
  EVP_PKEY_CTX *in_RSI;
  base_cache *in_RDI;
  uint in_stack_0000000c;
  mem_cache<cppcms::impl::process_settings> *in_stack_00000010;
  undefined1 add_ref;
  base_cache *p;
  
  p = in_RDI;
  process_settings::init(in_RSI);
  this = (intrusive_ptr<cppcms::impl::base_cache> *)
         mem_cache<cppcms::impl::process_settings>::operator_new((size_t)in_RDI);
  add_ref = (undefined1)((ulong)in_RDI >> 0x38);
  mem_cache<cppcms::impl::process_settings>::mem_cache(in_stack_00000010,in_stack_0000000c);
  booster::intrusive_ptr<cppcms::impl::base_cache>::intrusive_ptr(this,p,(bool)add_ref);
  return (intrusive_ptr<cppcms::impl::base_cache>)p;
}

Assistant:

booster::intrusive_ptr<base_cache> process_cache_factory(size_t memory,unsigned items)
{
	process_settings::init(memory);
	return new mem_cache<process_settings>(items);
}